

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_NtkMatch(Ifn_Ntk_t *p,word *pTruth,int nVars,int nConfls,int fVerbose,int fVeryVerbose,
                word *pConfig)

{
  word *pwVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  sat_solver *s;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  timespec ts;
  int local_80;
  ulong local_78;
  timespec local_70;
  long local_60;
  uint local_54;
  int local_50;
  int local_4c;
  int *local_48;
  word *local_40;
  long local_38;
  long lVar16;
  
  uVar12 = 1 << ((byte)nVars & 0x1f);
  iVar3 = clock_gettime(3,&local_70);
  if (iVar3 < 0) {
    local_60 = -1;
  }
  else {
    local_60 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  if (nVars == 0) {
    return 1;
  }
  local_50 = fVerbose;
  s = sat_solver_new();
  Ifn_Prepare(p,pTruth,nVars);
  sat_solver_setnvars(s,p->nPars);
  Ifn_NtkAddConstraints(p,s);
  if (fVeryVerbose != 0) {
    iVar3 = clock_gettime(3,&local_70);
    if (iVar3 < 0) {
      lVar9 = -1;
    }
    else {
      lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    Ifn_NtkMatchPrintStatus(s,0,1,-1,-1,lVar9 - local_60);
  }
  if ((pConfig != (word *)0x0) && (*pConfig != 0)) {
    __assert_fail("*pConfig == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                  ,0x541,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
  }
  if (nVars != 0x1f) {
    local_48 = p->Values;
    local_38 = (long)nConfls;
    if ((int)uVar12 < 2) {
      uVar12 = 1;
    }
    uVar10 = 0;
    local_78 = 0;
    local_54 = uVar12;
    local_40 = pTruth;
    do {
      auVar2 = _DAT_007ee2e0;
      iVar3 = p->nObjs;
      lVar9 = (long)iVar3;
      uVar12 = (uint)uVar10;
      if (0 < lVar9) {
        iVar4 = p->nVars;
        lVar6 = lVar9 + -1;
        auVar14._8_4_ = (int)lVar6;
        auVar14._0_8_ = lVar6;
        auVar14._12_4_ = (int)((ulong)lVar6 >> 0x20);
        lVar6 = 1;
        auVar14 = auVar14 ^ _DAT_007ee2e0;
        uVar7 = 0;
        auVar15 = _DAT_007ee2d0;
        do {
          auVar17 = auVar15 ^ auVar2;
          if ((bool)(~(auVar14._4_4_ < auVar17._4_4_ ||
                      auVar14._0_4_ < auVar17._0_4_ && auVar17._4_4_ == auVar14._4_4_) & 1)) {
            uVar8 = (uint)((uVar12 >> ((uint)uVar7 & 0x1f) & 1) != 0);
            if ((long)iVar4 <= (long)uVar7) {
              uVar8 = 0xffffffff;
            }
            p->Values[uVar7] = uVar8;
          }
          if (auVar17._12_4_ <= auVar14._12_4_ &&
              (auVar17._8_4_ <= auVar14._8_4_ || auVar17._12_4_ != auVar14._12_4_)) {
            uVar8 = (uint)((uVar12 >> ((uint)lVar6 & 0x1f) & 1) != 0);
            if (iVar4 <= lVar6) {
              uVar8 = 0xffffffff;
            }
            p->Values[uVar7 + 1] = uVar8;
          }
          uVar7 = uVar7 + 2;
          lVar16 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 2;
          auVar15._8_8_ = lVar16 + 2;
          lVar6 = lVar6 + 2;
        } while ((iVar3 + 1U & 0xfffffffe) != uVar7);
      }
      p->Values[lVar9 + -1] = (uint)((local_40[(int)uVar12 >> 6] >> (uVar10 & 0x3f) & 1) != 0);
      iVar3 = Ifn_NtkAddClauses(p,local_48,s);
      local_80 = 0;
      bVar13 = true;
      if (iVar3 == 0) goto LAB_003aab0c;
      iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,local_38,0,0,0);
      if (fVeryVerbose != 0) {
        local_4c = p->Values[(long)p->nObjs + -1];
        iVar4 = clock_gettime(3,&local_70);
        if (iVar4 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        Ifn_NtkMatchPrintStatus(s,(int)local_78 + 1,iVar3,uVar12,local_4c,lVar9 - local_60);
      }
      if (iVar3 != 1) goto LAB_003aab0c;
      lVar9 = (long)p->nObjs;
      if (p->nObjs < p->nPars) {
        do {
          iVar3 = sat_solver_var_value(s,(int)lVar9);
          p->Values[lVar9] = iVar3;
          lVar9 = lVar9 + 1;
        } while (lVar9 < p->nPars);
      }
      puVar5 = Ifn_NtkDeriveTruth(p,local_48);
      iVar3 = p->nWords;
      if (0 < (long)iVar3) {
        pwVar1 = p->pTruth;
        lVar9 = 0;
        do {
          puVar5[lVar9] = puVar5[lVar9] ^ pwVar1[lVar9];
          lVar9 = lVar9 + 1;
        } while (iVar3 != lVar9);
      }
      uVar12 = 1 << ((char)p->nVars - 6U & 0x1f);
      if (p->nVars < 7) {
        uVar12 = 1;
      }
      if ((int)uVar12 < 1) {
LAB_003aaae9:
        local_80 = 1;
        if (pConfig != (word *)0x0) {
          Ifn_NtkMatchCollectConfig(p,s,pConfig);
        }
        bVar13 = false;
LAB_003aab0c:
        if (local_50 != 0) {
          pcVar11 = "yes";
          if (bVar13) {
            pcVar11 = "no ";
          }
          uVar12 = sat_solver_nconflicts(s);
          printf("%s  Iter =%4d. Confl = %6d.  ",pcVar11,local_78,(ulong)uVar12);
          if (!bVar13) {
            Ifn_NtkMatchPrintConfig(p,s);
          }
          putchar(10);
        }
        sat_solver_delete(s);
        return local_80;
      }
      lVar9 = 0;
      while (uVar10 = *puVar5, uVar10 == 0) {
        lVar9 = lVar9 + -0x40;
        puVar5 = puVar5 + 1;
        if ((ulong)uVar12 * 0x40 + lVar9 == 0) goto LAB_003aaae9;
      }
      bVar13 = (int)uVar10 == 0;
      uVar7 = uVar10 >> 0x20;
      if (!bVar13) {
        uVar7 = uVar10;
      }
      iVar4 = (uint)bVar13 * 0x20;
      iVar3 = iVar4 + 0x10;
      uVar10 = uVar7 >> 0x10;
      if ((short)uVar7 != 0) {
        iVar3 = iVar4;
        uVar10 = uVar7;
      }
      iVar4 = iVar3 + 8;
      uVar7 = uVar10 >> 8;
      if ((char)uVar10 != '\0') {
        iVar4 = iVar3;
        uVar7 = uVar10;
      }
      iVar3 = iVar4 + 4;
      uVar10 = uVar7 >> 4;
      if ((uVar7 & 0xf) != 0) {
        iVar3 = iVar4;
        uVar10 = uVar7;
      }
      uVar12 = (uint)(uVar10 >> 2) & 0x3fffffff;
      iVar4 = iVar3 + 2;
      if ((uVar10 & 3) != 0) {
        uVar12 = (uint)uVar10;
        iVar4 = iVar3;
      }
      uVar12 = (~uVar12 & 1) + iVar4;
      if ((int)lVar9 - uVar12 == 1) goto LAB_003aaae9;
      uVar10 = (ulong)uVar12 - lVar9;
      uVar12 = (int)local_78 + 1;
      local_78 = (ulong)uVar12;
    } while (uVar12 != local_54);
  }
  __assert_fail("i < nIterMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                ,0x56e,"int Ifn_NtkMatch(Ifn_Ntk_t *, word *, int, int, int, int, word *)");
}

Assistant:

int Ifn_NtkMatch( Ifn_Ntk_t * p, word * pTruth, int nVars, int nConfls, int fVerbose, int fVeryVerbose, word * pConfig )
{
    word * pTruth1;
    int RetValue = 0;
    int nIterMax = (1<<nVars);
    int i, v, status, iMint = 0;
    abctime clk = Abc_Clock();
//    abctime clkTru = 0, clkSat = 0, clk2;
    sat_solver * pSat;
    if ( nVars == 0 )
        return 1;
    pSat = sat_solver_new();
    Ifn_Prepare( p, pTruth, nVars );
    sat_solver_setnvars( pSat, p->nPars );
    Ifn_NtkAddConstraints( p, pSat );
    if ( fVeryVerbose )
        Ifn_NtkMatchPrintStatus( pSat, 0, l_True, -1, -1, Abc_Clock() - clk );
    if ( pConfig ) assert( *pConfig == 0 );
    for ( i = 0; i < nIterMax; i++ )
    {
        // get variable assignment
        for ( v = 0; v < p->nObjs; v++ )
            p->Values[v] = v < p->nVars ? (iMint >> v) & 1 :  -1;
        p->Values[p->nObjs-1] = Abc_TtGetBit( pTruth, iMint );
        // derive clauses
        if ( !Ifn_NtkAddClauses( p, p->Values, pSat ) )
            break;
        // find assignment of parameters
//        clk2 = Abc_Clock();
        status = sat_solver_solve( pSat, NULL, NULL, nConfls, 0, 0, 0 );
//        clkSat += Abc_Clock() - clk2;
        if ( fVeryVerbose )
            Ifn_NtkMatchPrintStatus( pSat, i+1, status, iMint, p->Values[p->nObjs-1], Abc_Clock() - clk );
        if ( status != l_True )
            break;
        // collect assignment
        for ( v = p->nObjs; v < p->nPars; v++ )
            p->Values[v] = sat_solver_var_value(pSat, v);
        // find truth table
//        clk2 = Abc_Clock();
        pTruth1 = Ifn_NtkDeriveTruth( p, p->Values );
//        clkTru += Abc_Clock() - clk2;
        Abc_TtXor( pTruth1, pTruth1, p->pTruth, p->nWords, 0 );
        // find mismatch if present
        iMint = Abc_TtFindFirstBit( pTruth1, p->nVars );
        if ( iMint == -1 )
        {
            if ( pConfig ) 
                Ifn_NtkMatchCollectConfig( p, pSat, pConfig );
/*
            if ( pPerm )
            {
                int RetValue = Ifn_ManSatFindCofigBitsTest( p, pTruth, nVars, *pPerm );
                Ifn_NtkMatchPrintPerm( *pPerm, p->nInps );
                if ( RetValue == 0 )
                    printf( "Verification failed.\n" );
            }
*/
            RetValue = 1;
            break;
        }
    }
    assert( i < nIterMax );
    if ( fVerbose )
    {
        printf( "%s  Iter =%4d. Confl = %6d.  ", RetValue ? "yes":"no ", i, sat_solver_nconflicts(pSat) );
        if ( RetValue )
            Ifn_NtkMatchPrintConfig( p, pSat );
        printf( "\n" );
    }
    sat_solver_delete( pSat );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_PrintTime( 1, "Sat", clkSat );
//    Abc_PrintTime( 1, "Tru", clkTru );
    return RetValue;
}